

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PpContext.h
# Opt level: O1

void __thiscall glslang::TPpContext::push_include(TPpContext *this,IncludeResult *result)

{
  iterator *piVar1;
  _Elt_pointer ppIVar2;
  IncludeResult *local_10;
  
  local_10 = result;
  std::__cxx11::string::_M_assign((string *)&this->currentSourceFile);
  ppIVar2 = (this->includeStack).c.
            super__Deque_base<glslang::TShader::Includer::IncludeResult_*,_std::allocator<glslang::TShader::Includer::IncludeResult_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppIVar2 ==
      (this->includeStack).c.
      super__Deque_base<glslang::TShader::Includer::IncludeResult_*,_std::allocator<glslang::TShader::Includer::IncludeResult_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<glslang::TShader::Includer::IncludeResult*,std::allocator<glslang::TShader::Includer::IncludeResult*>>
    ::_M_push_back_aux<glslang::TShader::Includer::IncludeResult*const&>
              ((deque<glslang::TShader::Includer::IncludeResult*,std::allocator<glslang::TShader::Includer::IncludeResult*>>
                *)&this->includeStack,&local_10);
  }
  else {
    *ppIVar2 = local_10;
    piVar1 = &(this->includeStack).c.
              super__Deque_base<glslang::TShader::Includer::IncludeResult_*,_std::allocator<glslang::TShader::Includer::IncludeResult_*>_>
              ._M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  return;
}

Assistant:

void push_include(TShader::Includer::IncludeResult* result)
    {
        currentSourceFile = result->headerName;
        includeStack.push(result);
    }